

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O0

size_t __thiscall llama_file::impl::tell(impl *this)

{
  runtime_error *this_00;
  int *piVar1;
  char *pcVar2;
  undefined8 *in_RDI;
  long ret;
  string local_30 [32];
  size_t local_10;
  
  local_10 = ftell((FILE *)*in_RDI);
  if (local_10 == 0xffffffffffffffff) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    format_abi_cxx11_((char *)local_30,"ftell error: %s",pcVar2);
    std::runtime_error::runtime_error(this_00,local_30);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_10;
}

Assistant:

size_t tell() const {
// TODO: this ifdef is never true?
#ifdef _WIN32
        __int64 ret = _ftelli64(fp);
#else
        long ret = std::ftell(fp);
#endif
        if (ret == -1) {
            throw std::runtime_error(format("ftell error: %s", strerror(errno)));
        }

        return (size_t) ret;
    }